

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

Am_Value interpolate_1D(Am_Value *value1,Am_Value *value2,float tau)

{
  Am_Value *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  float fVar1;
  float fVar2;
  float v1;
  Am_Value AVar3;
  
  fVar1 = Am_Value::operator_cast_to_float(value2);
  fVar2 = Am_Value::operator_cast_to_float(in_RDX);
  if ((tau != -1.0) || (NAN(tau))) {
    fVar1 = fVar1 + (fVar2 - fVar1) * tau;
  }
  else {
    fVar1 = ABS(fVar1 - fVar2);
  }
  if (((value2->type & 0xfffe) == 2) && ((in_RDX->type & 0xfffe) == 2)) {
    value1->type = 2;
    value1->value = (anon_union_8_8_ea4c8939_for_value)(long)(int)fVar1;
  }
  else {
    value1->type = 5;
    (value1->value).float_value = fVar1;
  }
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = value1;
  return AVar3;
}

Assistant:

static Am_Value
interpolate_1D(const Am_Value &value1, const Am_Value &value2, float tau)
{
  float return_val;

  if (tau == Am_COMPUTE_DISTANCE) {
    // return magnitude of distance between value1 and value2
    return_val = (float)fabs((float)value1 - (float)value2);
  } else {
    float v1 = value1;
    float v2 = value2;

    // return interpolated value
    return_val = v1 + (v2 - v1) * tau;
  }

  if ((value1.type == Am_INT || value1.type == Am_LONG) &&
      (value2.type == Am_INT || value2.type == Am_LONG))
    return (int)return_val;
  else
    return return_val;
}